

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O3

void __thiscall
Eigen::internal::gemm_pack_rhs<double,_long,_4,_1,_false,_true>::operator()
          (gemm_pack_rhs<double,_long,_4,_1,_false,_true> *this,double *blockB,double *rhs,
          long rhsStride,long depth,long cols,long stride,long offset)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  long j2;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  if ((depth <= stride) && (offset <= stride)) {
    uVar5 = cols + 3;
    if (-1 < cols) {
      uVar5 = cols;
    }
    uVar6 = uVar5 & 0xfffffffffffffffc;
    if (cols < 4) {
      lVar7 = 0;
    }
    else {
      pdVar1 = rhs + 3;
      lVar7 = 0;
      lVar2 = 0;
      do {
        lVar7 = lVar7 + offset * 4;
        lVar3 = depth;
        pdVar4 = pdVar1;
        if (0 < depth) {
          do {
            blockB[lVar7] = pdVar4[-3];
            blockB[lVar7 + 1] = pdVar4[-2];
            blockB[lVar7 + 2] = pdVar4[-1];
            blockB[lVar7 + 3] = *pdVar4;
            lVar7 = lVar7 + 4;
            pdVar4 = pdVar4 + rhsStride;
            lVar3 = lVar3 + -1;
          } while (lVar3 != 0);
        }
        lVar7 = lVar7 + (stride - (offset + depth)) * 4;
        lVar2 = lVar2 + 4;
        pdVar1 = pdVar1 + 4;
      } while (lVar2 < (long)uVar6);
    }
    if ((long)uVar6 < cols) {
      pdVar1 = rhs + ((long)uVar5 >> 2) * 4;
      do {
        lVar7 = lVar7 + offset;
        lVar2 = depth;
        pdVar4 = pdVar1;
        if (0 < depth) {
          do {
            blockB[lVar7] = *pdVar4;
            lVar7 = lVar7 + 1;
            pdVar4 = pdVar4 + rhsStride;
            lVar2 = lVar2 + -1;
          } while (lVar2 != 0);
        }
        lVar7 = lVar7 + ((stride - depth) - offset);
        uVar6 = uVar6 + 1;
        pdVar1 = pdVar1 + 1;
      } while (uVar6 != cols);
    }
    return;
  }
  __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                ,0x4fb,
                "void Eigen::internal::gemm_pack_rhs<double, long, 4, 1, false, true>::operator()(Scalar *, const Scalar *, Index, Index, Index, Index, Index) [Scalar = double, Index = long, nr = 4, StorageOrder = 1, Conjugate = false, PanelMode = true]"
               );
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_rhs<Scalar, Index, nr, RowMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockB, const Scalar* rhs, Index rhsStride, Index depth, Index cols, Index stride, Index offset)
{
  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK RHS ROWMAJOR");
  EIGEN_UNUSED_VARIABLE(stride)
  EIGEN_UNUSED_VARIABLE(offset)
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index packet_cols = (cols/nr) * nr;
  Index count = 0;
  for(Index j2=0; j2<packet_cols; j2+=nr)
  {
    // skip what we have before
    if(PanelMode) count += nr * offset;
    for(Index k=0; k<depth; k++)
    {
      const Scalar* b0 = &rhs[k*rhsStride + j2];
                blockB[count+0] = cj(b0[0]);
                blockB[count+1] = cj(b0[1]);
      if(nr==4) blockB[count+2] = cj(b0[2]);
      if(nr==4) blockB[count+3] = cj(b0[3]);
      count += nr;
    }
    // skip what we have after
    if(PanelMode) count += nr * (stride-offset-depth);
  }
  // copy the remaining columns one at a time (nr==1)
  for(Index j2=packet_cols; j2<cols; ++j2)
  {
    if(PanelMode) count += offset;
    const Scalar* b0 = &rhs[j2];
    for(Index k=0; k<depth; k++)
    {
      blockB[count] = cj(b0[k*rhsStride]);
      count += 1;
    }
    if(PanelMode) count += stride-offset-depth;
  }
}